

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topten.c
# Opt level: O0

void write_topten(int fd,toptenentry *ttlist)

{
  bool bVar1;
  int local_1c;
  int i;
  toptenentry *ttlist_local;
  int fd_local;
  
  lseek(fd,0,0);
  ftruncate(fd,0);
  local_1c = 0;
  while( true ) {
    bVar1 = false;
    if ((local_1c < 10000) && (bVar1 = true, ttlist[local_1c].points < 1)) {
      bVar1 = ttlist[local_1c].deathlev != 0;
    }
    if (!bVar1) break;
    writeentry(fd,ttlist + local_1c);
    local_1c = local_1c + 1;
  }
  return;
}

Assistant:

static void write_topten(int fd, const struct toptenentry *ttlist)
{
    int i;
    
    lseek(fd, 0, SEEK_SET);
    ftruncate(fd, 0);
    for (i = 0; i < TTLISTLEN && validentry(ttlist[i]); i++)
	writeentry(fd, &ttlist[i]);
}